

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator*=(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> other_as_self_copy;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_28;
  
  if (this == other) {
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    dynamic_array(&local_28,
                  (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  other);
    local_28._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6b0;
    void_math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
    eval_mul_unary<16384u>(math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>&,math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>const&,std::enable_if<((16384u)/std::numeric_limits<unsigned_int>
    ::digits)>=math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                    &local_28,
               (enable_if_t<((16384U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
    local_28._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
    if ((ulong)local_28.elem_count != 0) {
      operator_delete(local_28.elems,(ulong)local_28.elem_count << 2);
    }
  }
  else {
    void_math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
    eval_mul_unary<16384u>(math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>&,math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>const&,std::enable_if<((16384u)/std::numeric_limits<unsigned_int>
    ::digits)>=math::wide_integer::uintwide_t<16384u,unsigned_int,std::
    allocator<unsigned_int>,false>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,other,
               (enable_if_t<((16384U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }